

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

value_type *
phmap::priv::NodeHashMapPolicy<int,int>::
new_element<std::allocator<std::pair<int_const,int>>,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
          (allocator<std::pair<const_int,_int>_> *alloc,piecewise_construct_t *args,
          tuple<int_&&> *args_1,tuple<> *args_2)

{
  pointer ppVar1;
  PairAlloc pair_alloc;
  
  ppVar1 = allocator_traits<std::allocator<std::pair<const_int,_int>_>_>::allocate(&pair_alloc,1);
  ppVar1->first =
       *(args_1->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>._M_head_impl;
  ppVar1->second = 0;
  return ppVar1;
}

Assistant:

static value_type* new_element(Allocator* alloc, Args&&... args) {
        using PairAlloc = typename phmap::allocator_traits<
            Allocator>::template rebind_alloc<value_type>;
        PairAlloc pair_alloc(*alloc);
        value_type* res =
            phmap::allocator_traits<PairAlloc>::allocate(pair_alloc, 1);
        phmap::allocator_traits<PairAlloc>::construct(pair_alloc, res,
                                                      std::forward<Args>(args)...);
        return res;
    }